

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<char> * __thiscall
cimg_library::CImgList<char>::get_append
          (CImg<char> *__return_storage_ptr__,CImgList<char> *this,char axis,float align)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  CImg<char> *pCVar4;
  CImg<char> *pCVar5;
  void *pvVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int l_2;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int l;
  char local_34 [4];
  
  pCVar4 = this->_data;
  uVar13 = this->_width;
  if (uVar13 == 0 || pCVar4 == (CImg<char> *)0x0) {
    __return_storage_ptr__->_data = (char *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else if (uVar13 == 1) {
    CImg<char>::operator+(__return_storage_ptr__,pCVar4);
  }
  else {
    __return_storage_ptr__->_data = (char *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
    cVar7 = axis + ' ';
    if ((byte)(axis + 0xa5U) < 0xe6) {
      cVar7 = axis;
    }
    uVar8 = 0;
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    if (cVar7 == 'x') {
      uVar14 = 0;
      uVar10 = 0;
      uVar15 = 0;
      for (lVar12 = 0; (ulong)uVar13 * 0x20 != lVar12; lVar12 = lVar12 + 0x20) {
        if (*(long *)((long)&pCVar4->_data + lVar12) != 0) {
          uVar8 = uVar8 + *(int *)((long)&pCVar4->_width + lVar12);
          uVar1 = *(uint *)((long)&pCVar4->_height + lVar12);
          uVar2 = *(uint *)((long)&pCVar4->_depth + lVar12);
          if (uVar14 <= uVar1) {
            uVar14 = uVar1;
          }
          if (uVar10 <= uVar2) {
            uVar10 = uVar2;
          }
          uVar1 = *(uint *)((long)&pCVar4->_spectrum + lVar12);
          if (uVar15 <= uVar1) {
            uVar15 = uVar1;
          }
        }
      }
      local_34[3] = 0;
      CImg<char>::assign(__return_storage_ptr__,uVar8,uVar14,uVar10,uVar15,local_34 + 3);
      if (__return_storage_ptr__->_data != (char *)0x0) {
        lVar9 = 0;
        uVar16 = 0;
        for (lVar12 = 0; lVar12 < (int)this->_width; lVar12 = lVar12 + 1) {
          pCVar5 = this->_data;
          pCVar4 = (CImg<char> *)((long)&pCVar5->_width + lVar9);
          pvVar6 = *(void **)((long)&pCVar5->_data + lVar9);
          if (pvVar6 != (void *)0x0) {
            iVar3 = *(int *)((long)&pCVar5->_height + lVar9);
            iVar11 = *(int *)((long)&pCVar5->_depth + lVar9);
            if (((((iVar3 == 1) && (iVar11 == 1)) &&
                 (iVar11 = 1, *(int *)((long)&pCVar5->_spectrum + lVar9) == 1)) &&
                ((__return_storage_ptr__->_height == 1 && (__return_storage_ptr__->_depth == 1))))
               && (__return_storage_ptr__->_spectrum == 1)) {
              memcpy(__return_storage_ptr__->_data + uVar16,pvVar6,(ulong)pCVar4->_width);
            }
            else {
              CImg<char>::draw_image
                        (__return_storage_ptr__,(int)uVar16,(int)((float)(uVar14 - iVar3) * align),
                         (int)((float)(uVar10 - iVar11) * align),
                         (int)((float)(uVar15 - *(int *)((long)&pCVar5->_spectrum + lVar9)) * align)
                         ,pCVar4,1.0);
            }
          }
          uVar16 = (ulong)((int)uVar16 + pCVar4->_width);
          lVar9 = lVar9 + 0x20;
        }
      }
    }
    else {
      lVar12 = (ulong)uVar13 * 0x20;
      if (cVar7 == 'y') {
        uVar13 = 0;
        uVar10 = 0;
        uVar8 = 0;
        uVar14 = 0;
        for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 0x20) {
          if (*(long *)((long)&pCVar4->_data + lVar9) != 0) {
            uVar15 = *(uint *)((long)&pCVar4->_width + lVar9);
            if (uVar13 <= uVar15) {
              uVar13 = uVar15;
            }
            uVar15 = *(uint *)((long)&pCVar4->_depth + lVar9);
            uVar10 = uVar10 + *(int *)((long)&pCVar4->_height + lVar9);
            if (uVar8 <= uVar15) {
              uVar8 = uVar15;
            }
            uVar15 = *(uint *)((long)&pCVar4->_spectrum + lVar9);
            if (uVar14 <= uVar15) {
              uVar14 = uVar15;
            }
          }
        }
        local_34[2] = 0;
        CImg<char>::assign(__return_storage_ptr__,uVar13,uVar10,uVar8,uVar14,local_34 + 2);
        if (__return_storage_ptr__->_data != (char *)0x0) {
          lVar12 = 0;
          uVar16 = 0;
          for (lVar9 = 0; lVar9 < (int)this->_width; lVar9 = lVar9 + 1) {
            pCVar4 = this->_data;
            pvVar6 = *(void **)((long)&pCVar4->_data + lVar12);
            if (pvVar6 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar4->_width + lVar12);
              iVar11 = *(int *)((long)&pCVar4->_depth + lVar12);
              if (((iVar11 == 1 && iVar3 == 1) &&
                  (iVar11 = 1, *(int *)((long)&pCVar4->_spectrum + lVar12) == 1)) &&
                 ((iVar11 = 1, __return_storage_ptr__->_width == 1 &&
                  ((iVar11 = 1, __return_storage_ptr__->_depth == 1 &&
                   (iVar11 = 1, __return_storage_ptr__->_spectrum == 1)))))) {
                memcpy(__return_storage_ptr__->_data + uVar16,pvVar6,
                       (ulong)*(uint *)((long)&pCVar4->_height + lVar12));
              }
              else {
                CImg<char>::draw_image
                          (__return_storage_ptr__,(int)((float)(uVar13 - iVar3) * align),(int)uVar16
                           ,(int)((float)(uVar8 - iVar11) * align),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar4->_spectrum + lVar12)) *
                                align),(CImg<char> *)((long)&pCVar4->_width + lVar12),1.0);
              }
            }
            uVar16 = (ulong)(uint)((int)uVar16 + *(int *)((long)&pCVar4->_height + lVar12));
            lVar12 = lVar12 + 0x20;
          }
        }
      }
      else if (cVar7 == 'z') {
        uVar13 = 0;
        uVar8 = 0;
        uVar10 = 0;
        uVar14 = 0;
        for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 0x20) {
          if (*(long *)((long)&pCVar4->_data + lVar9) != 0) {
            uVar15 = *(uint *)((long)&pCVar4->_width + lVar9);
            uVar1 = *(uint *)((long)&pCVar4->_height + lVar9);
            if (uVar13 <= uVar15) {
              uVar13 = uVar15;
            }
            if (uVar8 <= uVar1) {
              uVar8 = uVar1;
            }
            uVar10 = uVar10 + *(int *)((long)&pCVar4->_depth + lVar9);
            uVar15 = *(uint *)((long)&pCVar4->_spectrum + lVar9);
            if (uVar14 <= uVar15) {
              uVar14 = uVar15;
            }
          }
        }
        local_34[1] = 0;
        CImg<char>::assign(__return_storage_ptr__,uVar13,uVar8,uVar10,uVar14,local_34 + 1);
        if (__return_storage_ptr__->_data != (char *)0x0) {
          lVar12 = 0;
          uVar16 = 0;
          for (lVar9 = 0; lVar9 < (int)this->_width; lVar9 = lVar9 + 1) {
            pCVar4 = this->_data;
            pvVar6 = *(void **)((long)&pCVar4->_data + lVar12);
            if (pvVar6 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar4->_width + lVar12);
              iVar11 = *(int *)((long)&pCVar4->_height + lVar12);
              if (((iVar11 == 1 && iVar3 == 1) &&
                  (iVar11 = 1, *(int *)((long)&pCVar4->_spectrum + lVar12) == 1)) &&
                 ((iVar11 = 1, __return_storage_ptr__->_width == 1 &&
                  ((iVar11 = 1, __return_storage_ptr__->_height == 1 &&
                   (iVar11 = 1, __return_storage_ptr__->_spectrum == 1)))))) {
                memcpy(__return_storage_ptr__->_data + uVar16,pvVar6,
                       (ulong)*(uint *)((long)&pCVar4->_depth + lVar12));
              }
              else {
                CImg<char>::draw_image
                          (__return_storage_ptr__,(int)((float)(uVar13 - iVar3) * align),
                           (int)((float)(uVar8 - iVar11) * align),(int)uVar16,
                           (int)((float)(uVar14 - *(int *)((long)&pCVar4->_spectrum + lVar12)) *
                                align),(CImg<char> *)((long)&pCVar4->_width + lVar12),1.0);
              }
            }
            uVar16 = (ulong)(uint)((int)uVar16 + *(int *)((long)&pCVar4->_depth + lVar12));
            lVar12 = lVar12 + 0x20;
          }
        }
      }
      else {
        uVar13 = 0;
        uVar8 = 0;
        uVar14 = 0;
        uVar10 = 0;
        for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 0x20) {
          if (*(long *)((long)&pCVar4->_data + lVar9) != 0) {
            uVar15 = *(uint *)((long)&pCVar4->_width + lVar9);
            uVar1 = *(uint *)((long)&pCVar4->_height + lVar9);
            if (uVar13 <= uVar15) {
              uVar13 = uVar15;
            }
            if (uVar8 <= uVar1) {
              uVar8 = uVar1;
            }
            uVar15 = *(uint *)((long)&pCVar4->_depth + lVar9);
            if (uVar14 <= uVar15) {
              uVar14 = uVar15;
            }
            uVar10 = uVar10 + *(int *)((long)&pCVar4->_spectrum + lVar9);
          }
        }
        local_34[0] = '\0';
        CImg<char>::assign(__return_storage_ptr__,uVar13,uVar8,uVar14,uVar10,local_34);
        if (__return_storage_ptr__->_data != (char *)0x0) {
          lVar12 = 0;
          uVar16 = 0;
          for (lVar9 = 0; lVar9 < (int)this->_width; lVar9 = lVar9 + 1) {
            pCVar4 = this->_data;
            pvVar6 = *(void **)((long)&pCVar4->_data + lVar12);
            if (pvVar6 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar4->_width + lVar12);
              iVar11 = *(int *)((long)&pCVar4->_height + lVar12);
              if ((((iVar11 == 1 && iVar3 == 1) &&
                   (iVar11 = 1, *(int *)((long)&pCVar4->_depth + lVar12) == 1)) &&
                  (iVar11 = 1, __return_storage_ptr__->_width == 1)) &&
                 ((iVar11 = 1, __return_storage_ptr__->_height == 1 &&
                  (iVar11 = 1, __return_storage_ptr__->_depth == 1)))) {
                memcpy(__return_storage_ptr__->_data + uVar16,pvVar6,
                       (ulong)*(uint *)((long)&pCVar4->_spectrum + lVar12));
              }
              else {
                CImg<char>::draw_image
                          (__return_storage_ptr__,(int)((float)(uVar13 - iVar3) * align),
                           (int)((float)(uVar8 - iVar11) * align),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar4->_depth + lVar12)) * align)
                           ,(int)uVar16,(CImg<char> *)((long)&pCVar4->_width + lVar12),1.0);
              }
            }
            uVar16 = (ulong)(uint)((int)uVar16 + *(int *)((long)&pCVar4->_spectrum + lVar12));
            lVar12 = lVar12 + 0x20;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::lowercase(axis)) {
      case 'x' : { // Along the X-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._height==1 && img._depth==1 && img._spectrum==1 &&
                  res._height==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._width);
              else
                res.draw_image(pos,
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy+=img._height;
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._depth==1 && img._spectrum==1 &&
                  res._width==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._height);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               pos,
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz+=img._depth;
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._spectrum==1 &&
                  res._width==1 && res._height==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._depth);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               pos,
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._depth==1 &&
                  res._width==1 && res._height==1 && res._depth==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._spectrum);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               pos,
                               img);
            }
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }